

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int nsize;
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  b;
  datanode node [60];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1938;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f8;
  string local_18d8;
  string local_18b8;
  string local_1898;
  datanode local_1878 [59];
  undefined1 local_28 [16];
  
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1918.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1958.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1898,argv[1],(allocator *)local_1878);
  readvector(&local_1918,&local_1898);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1898._M_dataplus._M_p != &local_1898.field_2) {
    operator_delete(local_1898._M_dataplus._M_p);
  }
  lVar1 = 0x1860;
  paVar2 = &local_1878[0].typeofIOWG.field_2;
  do {
    *(char **)(paVar2->_M_local_buf + -0x38) = paVar2->_M_local_buf + -0x28;
    *(char *)((long)paVar2 + -0x30) = '\0';
    *(char *)((long)paVar2 + -0x2f) = '\0';
    *(char *)((long)paVar2 + -0x2e) = '\0';
    *(char *)((long)paVar2 + -0x2d) = '\0';
    *(char *)((long)paVar2 + -0x2c) = '\0';
    *(char *)((long)paVar2 + -0x2b) = '\0';
    *(char *)((long)paVar2 + -0x2a) = '\0';
    *(char *)((long)paVar2 + -0x29) = '\0';
    paVar2->_M_local_buf[-0x28] = '\0';
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)(paVar2->_M_local_buf + -0x10) = paVar2;
    *(char *)((long)paVar2 + -8) = '\0';
    *(char *)((long)paVar2 + -7) = '\0';
    *(char *)((long)paVar2 + -6) = '\0';
    *(char *)((long)paVar2 + -5) = '\0';
    *(char *)((long)paVar2 + -4) = '\0';
    *(char *)((long)paVar2 + -3) = '\0';
    *(char *)((long)paVar2 + -2) = '\0';
    *(char *)((long)paVar2 + -1) = '\0';
    paVar2->_M_local_buf[0] = '\0';
    *(char **)(paVar2->_M_local_buf + 0x10) = paVar2->_M_local_buf + 0x20;
    *(char *)((long)paVar2 + 0x18) = '\0';
    *(char *)((long)paVar2 + 0x19) = '\0';
    *(char *)((long)paVar2 + 0x1a) = '\0';
    *(char *)((long)paVar2 + 0x1b) = '\0';
    *(char *)((long)paVar2 + 0x1c) = '\0';
    *(char *)((long)paVar2 + 0x1d) = '\0';
    *(char *)((long)paVar2 + 0x1e) = '\0';
    *(char *)((long)paVar2 + 0x1f) = '\0';
    paVar2->_M_local_buf[0x20] = '\0';
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar2->_M_local_buf + 0x68);
    lVar1 = lVar1 + -0x68;
  } while (lVar1 != 0);
  paVar2 = &local_1938.field_2;
  local_1938._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1938,"");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1918,
             &local_1938);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1938._M_dataplus._M_p != paVar2) {
    operator_delete(local_1938._M_dataplus._M_p);
  }
  local_1938._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1938,"module ","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1958,
             &local_1938);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1938._M_dataplus._M_p != paVar2) {
    operator_delete(local_1938._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_18b8,argv[1],(allocator *)&local_18f8);
  remove_txt(&local_1938,&local_18b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18b8._M_dataplus._M_p != &local_18b8.field_2) {
    operator_delete(local_18b8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1958,&local_1938);
  nsize = findallnodes(&local_1918,local_1878);
  printnode(&local_1958,local_1878,nsize);
  datapathgenerator(&local_1918,local_1878);
  findfunction(&local_1918,&local_1958,local_1878);
  local_18f8._M_dataplus._M_p = (pointer)&local_18f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_18f8,"endmodule","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1958,
             &local_18f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18f8._M_dataplus._M_p != &local_18f8.field_2) {
    operator_delete(local_18f8._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_18d8,argv[2],(allocator *)&local_18f8);
  writevector(&local_1958,&local_18d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_18d8._M_dataplus._M_p != &local_18d8.field_2) {
    operator_delete(local_18d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1938._M_dataplus._M_p != paVar2) {
    operator_delete(local_1938._M_dataplus._M_p);
  }
  lVar1 = -0x1860;
  puVar3 = local_28;
  do {
    if (puVar3 != *(undefined1 **)(puVar3 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar3 + -0x10));
    }
    if (puVar3 + -0x20 != *(undefined1 **)(puVar3 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar3 + -0x30));
    }
    if (puVar3 + -0x48 != *(undefined1 **)(puVar3 + -0x58)) {
      operator_delete(*(undefined1 **)(puVar3 + -0x58));
    }
    puVar3 = puVar3 + -0x68;
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1958);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1918);
  return 0;
}

Assistant:

int main(int argc, char*argv[]) {
	vector<string> b;			//read vector
	vector<string> c;			//write vector
	readvector(b,argv[1]);	
	
	datanode node[60];
	b.push_back("\0");
	c.push_back("module ");
	string str = remove_txt(argv[1]);	//find the name of module
	c.push_back(str);
	int nsize=findallnodes(b,node);
	printnode(c, node, nsize);		//print the node..can be removed
	datapathgenerator(b, node);		//to generate data path  critical value
	findfunction(b, c, node); 		// finds the add,sub... functions and converts them to module in verilog
	
	c.push_back("endmodule");
	writevector(c, argv[2]);
	//print(c);
	return 0;
}